

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void split_color(coloring *c,int cf,int ff)

{
  int iVar1;
  int fb;
  int cb;
  int ff_local;
  int cf_local;
  coloring *c_local;
  
  iVar1 = c->clen[cf];
  c->clen[cf] = (ff + -1) - cf;
  c->clen[ff] = (cf + iVar1) - ff;
  fix_fronts(c,ff,ff);
  return;
}

Assistant:

static void
split_color(struct coloring *c, int cf, int ff)
{
    int cb, fb;

    /* Fix lengths */
    fb = ff - 1;
    cb = cf + c->clen[cf];
    c->clen[cf] = fb - cf;
    c->clen[ff] = cb - ff;

    /* Fix cell front pointers */
    fix_fronts(c, ff, ff);
}